

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

size_t __thiscall serial::Serial::readline(Serial *this,string *buffer,size_t size,string *eol)

{
  long lVar1;
  char *pcVar2;
  allocator *paVar3;
  Serial *this_00;
  string *__rhs;
  size_t sVar4;
  uint8_t *puVar5;
  undefined8 uStack_d0;
  size_t local_c8;
  byte local_b9;
  char *local_b8;
  uint8_t *local_b0;
  allocator *local_a8;
  size_t local_a0;
  Serial *local_98;
  string *local_90;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_t local_50;
  size_t bytes_read;
  size_t read_so_far;
  uint8_t *buffer_;
  size_t eol_len;
  ScopedReadLock lock;
  string *eol_local;
  size_t size_local;
  string *buffer_local;
  Serial *this_local;
  
  uStack_d0 = 0x13c2ba;
  local_98 = this;
  local_90 = eol;
  lock.pimpl_ = (SerialImpl *)eol;
  ScopedReadLock::ScopedReadLock((ScopedReadLock *)&eol_len,this->pimpl_);
  uStack_d0 = 0x13c2c6;
  buffer_ = (uint8_t *)std::__cxx11::string::length();
  lVar1 = -(size + 0xf & 0xfffffffffffffff0);
  read_so_far = (long)&local_c8 + lVar1;
  bytes_read = 0;
  while( true ) {
    this_00 = local_98;
    puVar5 = (uint8_t *)(read_so_far + bytes_read);
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c309;
    local_a0 = read_(this_00,puVar5,1);
    bytes_read = local_a0 + bytes_read;
    local_50 = local_a0;
    if (local_a0 == 0) break;
    local_b0 = buffer_;
    local_b8 = (char *)((read_so_far + bytes_read) - (long)buffer_);
    local_a8 = &local_81;
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c376;
    std::allocator<char>::allocator();
    paVar3 = local_a8;
    puVar5 = local_b0;
    pcVar2 = local_b8;
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c394;
    std::__cxx11::string::string((string *)&local_80,pcVar2,(ulong)puVar5,paVar3);
    __rhs = local_90;
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c3a6;
    local_b9 = std::operator==(&local_80,__rhs);
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c3b5;
    std::__cxx11::string::~string((string *)&local_80);
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c3be;
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    if (((local_b9 & 1) != 0) || (bytes_read == size)) break;
  }
  sVar4 = read_so_far;
  *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c405;
  std::__cxx11::string::append((char *)buffer,sVar4);
  local_c8 = bytes_read;
  *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x13c41b;
  ScopedReadLock::~ScopedReadLock((ScopedReadLock *)&eol_len);
  return local_c8;
}

Assistant:

size_t
Serial::readline (string &buffer, size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
                              (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  while (true)
  {
    size_t bytes_read = this->read_ (buffer_ + read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      break; // EOL found
    }
    if (read_so_far == size) {
      break; // Reached the maximum read length
    }
  }
  buffer.append(reinterpret_cast<const char*> (buffer_), read_so_far);
  return read_so_far;
}